

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O3

bool __thiscall QXmlUtils::isEncName(QXmlUtils *this,QStringView encName)

{
  ushort uVar1;
  bool bVar2;
  CutResult CVar3;
  qsizetype qVar4;
  ushort *puVar5;
  long lVar6;
  long in_FS_OFFSET;
  qsizetype local_20;
  qsizetype local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this == (QXmlUtils *)0x0) || (0x19 < (*(ushort *)encName.m_size & 0xffffffdf) - 0x41)) {
    bVar2 = false;
  }
  else {
    local_18 = 1;
    local_20 = -1;
    CVar3 = QtPrivate::QContainerImplHelper::mid((qsizetype)this,&local_18,&local_20);
    if (CVar3 == Null) {
      qVar4 = 0;
      puVar5 = (ushort *)0x0;
    }
    else {
      puVar5 = (ushort *)encName.m_size + local_18;
      qVar4 = local_20;
    }
    if (qVar4 != 0) {
      lVar6 = 0;
      do {
        uVar1 = *(ushort *)((long)puVar5 + lVar6);
        if (0x19 < uVar1 - 0x41 && (0x19 < uVar1 - 0x61 && 9 < uVar1 - 0x30)) {
          bVar2 = false;
          if ((0x32 < uVar1 - 0x2d) ||
             ((0x4000000000003U >> ((ulong)(uVar1 - 0x2d) & 0x3f) & 1) == 0)) goto LAB_002ff3f0;
        }
        lVar6 = lVar6 + 2;
      } while (qVar4 * 2 != lVar6);
    }
    bVar2 = true;
  }
LAB_002ff3f0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QXmlUtils::isEncName(QStringView encName)
{
    // Valid encoding names are given by "[A-Za-z][A-Za-z0-9._\\-]*"
    if (encName.isEmpty())
        return false;
    const auto first = encName.front().unicode();
    if (!(isAsciiLower(first) || isAsciiUpper(first)))
        return false;
    for (QChar ch : encName.mid(1)) {
        const auto cp = ch.unicode();
        if (isAsciiLetterOrNumber(cp) || cp == '.' || cp == '_' || cp == '-')
            continue;
        return false;
    }
    return true;
}